

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void sqlcheck::CheckNotNullUsage(Configuration *state,string *sql_statement,bool *print_statement)

{
  bool bVar1;
  string title;
  string local_90;
  string local_70;
  regex pattern;
  
  bVar1 = IsCreateStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"(not null)",0x10);
    title._M_dataplus._M_p = (pointer)&title.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&title,"NOT NULL Usage","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,title._M_dataplus._M_p,
               title._M_dataplus._M_p + title._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,anon_var_dwarf_7b21d,anon_var_dwarf_7b21d + 0x100);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_NONE,PATTERN_TYPE_QUERY,
                 &local_90,&local_70,true,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)title._M_dataplus._M_p != &title.field_2) {
      operator_delete(title._M_dataplus._M_p);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  return;
}

Assistant:

void CheckNotNullUsage(Configuration& state,
                       const std::string& sql_statement,
                       bool& print_statement) {

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(not null)");
  std::string title = "NOT NULL Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use NOT NULL only if the column cannot have a missing value:  "
      "When you declare a column as NOT NULL, it should be because it would make no sense "
      "for the row to exist without a value in that column. "
      "Use null to signify a missing value for any data type.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_NONE,
               pattern_type,
               title,
               message,
               true);

}